

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_faceid_spacing
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT faceid,REF_DBL set_normal_spacing,
          REF_DBL ceil_normal_spacing,REF_DBL tangential_aspect_ratio)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_INT *vector;
  REF_DBL *vector_00;
  ulong uVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  REF_NODE ref_node;
  long lVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  int iVar15;
  REF_DBL *pRVar16;
  REF_EDGE pRVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  REF_DBL normal [3];
  REF_EDGE ref_edge;
  REF_DBL logm [6];
  REF_INT nodes [27];
  REF_DBL m [6];
  double local_248 [4];
  double dStack_228;
  double local_220;
  double local_218 [4];
  double dStack_1f8;
  double local_1f0;
  REF_DBL local_1e0;
  REF_DBL local_1d8;
  REF_DBL local_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double local_1b0;
  REF_NODE local_1a8;
  double local_1a0;
  REF_GRID local_198;
  long local_190;
  long local_188;
  double local_180 [3];
  REF_EDGE local_168 [5];
  double local_140 [7];
  REF_DBL local_108;
  double local_100 [5];
  REF_INT local_d8 [28];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  uVar3 = ref_node->max;
  uVar4 = (ulong)uVar3;
  local_1e0 = tangential_aspect_ratio;
  local_1d8 = ceil_normal_spacing;
  local_1d0 = set_normal_spacing;
  if ((int)uVar3 < 0) {
    pcVar13 = "malloc hits of REF_INT negative";
    uVar10 = 0x92c;
LAB_001d223f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar10
           ,"ref_metric_faceid_spacing",pcVar13);
    RVar2 = 1;
  }
  else {
    ref_cell = ref_grid->cell[3];
    vector = (REF_INT *)malloc(uVar4 * 4);
    auVar22 = _DAT_00213060;
    if (vector == (REF_INT *)0x0) {
      pcVar13 = "malloc hits of REF_INT NULL";
      uVar10 = 0x92c;
    }
    else {
      if (uVar4 != 0) {
        lVar6 = uVar4 - 1;
        auVar19._8_4_ = (int)lVar6;
        auVar19._0_8_ = lVar6;
        auVar19._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = 0;
        auVar19 = auVar19 ^ _DAT_00213060;
        auVar21 = _DAT_00213ba0;
        auVar24 = _DAT_00213050;
        do {
          auVar25 = auVar24 ^ auVar22;
          iVar15 = auVar19._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar15 && auVar19._0_4_ < auVar25._0_4_ ||
                      iVar15 < auVar25._4_4_) & 1)) {
            *(undefined4 *)((long)vector + lVar6) = 0;
          }
          if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
              auVar25._12_4_ <= auVar19._12_4_) {
            *(undefined4 *)((long)vector + lVar6 + 4) = 0;
          }
          auVar25 = auVar21 ^ auVar22;
          iVar5 = auVar25._4_4_;
          if (iVar5 <= iVar15 && (iVar5 != iVar15 || auVar25._0_4_ <= auVar19._0_4_)) {
            *(undefined4 *)((long)vector + lVar6 + 8) = 0;
            *(undefined4 *)((long)vector + lVar6 + 0xc) = 0;
          }
          lVar8 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 4;
          auVar24._8_8_ = lVar8 + 4;
          lVar8 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 4;
          auVar21._8_8_ = lVar8 + 4;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)(uVar3 + 3 >> 2) << 4 != lVar6);
      }
      local_198 = ref_grid;
      vector_00 = (REF_DBL *)malloc(uVar4 * 0x30);
      if (vector_00 != (REF_DBL *)0x0) {
        if (uVar4 != 0) {
          memset(vector_00,0,(uVar4 * 6 & 0xffffffff) << 3);
        }
        if (0 < ref_cell->max) {
          local_180[1] = local_1d0 * 1e+20 * local_1d0;
          if (local_180[1] <= -local_180[1]) {
            local_180[1] = -local_180[1];
          }
          local_180[2] = 0.0;
          local_1a0 = 1.0 / (local_1d0 * local_1d0);
          iVar15 = 0;
          local_1a8 = ref_node;
          do {
            RVar2 = ref_cell_nodes(ref_cell,iVar15,local_d8);
            if ((RVar2 == 0) && (local_d8[ref_cell->node_per] == faceid)) {
              uVar3 = ref_node_tri_normal(ref_node,local_d8,&local_1c8);
              if (uVar3 != 0) {
                pcVar13 = "normal area";
                uVar10 = 0x932;
                goto LAB_001d24f3;
              }
              uVar3 = ref_math_normalize(&local_1c8);
              if (uVar3 != 0) {
                pcVar13 = "normalize";
                uVar10 = 0x933;
                goto LAB_001d24f3;
              }
              ref_node = local_1a8;
              if (0 < ref_cell->node_per) {
                lVar6 = 0;
                do {
                  local_180[0] = (double)(long)local_d8[lVar6];
                  local_188 = (long)local_180[0] * 6;
                  pRVar16 = metric + (long)local_180[0] * 6;
                  uVar3 = ref_matrix_diag_m(pRVar16,(REF_DBL *)local_168);
                  if (uVar3 != 0) {
                    pcVar13 = "decomp";
                    uVar10 = 0x8e8;
                    goto LAB_001d24c8;
                  }
                  uVar4 = 0xffffffff;
                  pdVar7 = local_140;
                  uVar9 = 0;
                  dVar18 = -2.0;
                  do {
                    dVar20 = *pdVar7 * local_1b8 + pdVar7[-2] * local_1c8 + pdVar7[-1] * dStack_1c0;
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    if (dVar18 < dVar20) {
                      uVar4 = uVar9 & 0xffffffff;
                      dVar18 = dVar20;
                    }
                    uVar9 = uVar9 + 1;
                    pdVar7 = pdVar7 + 3;
                  } while (uVar9 != 3);
                  if ((int)uVar4 == -1) {
                    pcVar13 = "first_i not set";
                    uVar10 = 0x8f4;
LAB_001d244d:
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,uVar10,"ref_metric_closest_d",pcVar13);
                    uVar3 = 1;
LAB_001d24d2:
                    pcVar13 = "closest";
                    uVar10 = 0x938;
                    goto LAB_001d24f3;
                  }
                  iVar5 = -1;
                  uVar9 = 0;
                  pRVar17 = (REF_EDGE)0xbff0000000000000;
                  do {
                    if ((uVar4 != uVar9) &&
                       ((iVar5 == -1 || ((double)pRVar17 < (double)local_168[uVar9])))) {
                      iVar5 = (int)uVar9;
                      pRVar17 = local_168[uVar9];
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 != 3);
                  local_190 = lVar6;
                  if (iVar5 == -1) {
                    pcVar13 = "second_i not set";
                    uVar10 = 0x8fe;
                    goto LAB_001d244d;
                  }
                  if (iVar5 == (int)uVar4) {
                    pcVar13 = "first_i same as second_i";
                    uVar10 = 0x8ff;
                    goto LAB_001d244d;
                  }
                  local_220 = local_1b8;
                  local_248[3] = local_1c8;
                  dStack_228 = dStack_1c0;
                  uVar3 = ref_math_normalize(local_248 + 3);
                  if (uVar3 != 0) {
                    pcVar13 = "first";
                    uVar10 = 0x904;
LAB_001d24c8:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,uVar10,"ref_metric_closest_d",(ulong)uVar3,pcVar13);
                    goto LAB_001d24d2;
                  }
                  lVar6 = 0;
                  do {
                    local_218[lVar6] = (double)local_168[iVar5 * 3 + 3 + (int)lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  dVar23 = dStack_228 * local_218[1];
                  dVar20 = local_248[3] * local_218[0];
                  dVar18 = local_220 * local_218[2];
                  lVar6 = 6;
                  do {
                    local_248[lVar6] =
                         local_180[lVar6] * -(dVar18 + dVar20 + dVar23) + local_248[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 9);
                  uVar3 = ref_math_normalize(local_218);
                  if (uVar3 != 0) {
                    pcVar13 = "second";
                    uVar10 = 0x90e;
                    goto LAB_001d24c8;
                  }
                  local_218[3] = local_218[2] * dStack_228 - local_220 * local_218[1];
                  dStack_1f8 = local_218[0] * local_220 - local_248[3] * local_218[2];
                  local_1f0 = local_248[3] * local_218[1] - local_218[0] * dStack_228;
                  uVar3 = ref_math_normalize(local_218 + 3);
                  if (uVar3 != 0) {
                    pcVar13 = "third";
                    uVar10 = 0x912;
                    goto LAB_001d24c8;
                  }
                  dVar18 = (pRVar16[5] * local_220 +
                           pRVar16[2] * local_248[3] + dStack_228 * pRVar16[4]) * local_220 +
                           (pRVar16[2] * local_220 +
                           *pRVar16 * local_248[3] + pRVar16[1] * dStack_228) * local_248[3] +
                           (pRVar16[4] * local_220 +
                           pRVar16[1] * local_248[3] + pRVar16[3] * dStack_228) * dStack_228;
                  if (dVar18 < 0.0) {
                    dVar18 = sqrt(dVar18);
                  }
                  else {
                    dVar18 = SQRT(dVar18);
                  }
                  local_248[0] = dVar18 * dVar18;
                  dVar18 = (pRVar16[5] * local_218[2] +
                           pRVar16[2] * local_218[0] + local_218[1] * pRVar16[4]) * local_218[2] +
                           (pRVar16[2] * local_218[2] +
                           *pRVar16 * local_218[0] + pRVar16[1] * local_218[1]) * local_218[0] +
                           (pRVar16[4] * local_218[2] +
                           pRVar16[1] * local_218[0] + pRVar16[3] * local_218[1]) * local_218[1];
                  if (dVar18 < 0.0) {
                    dVar18 = sqrt(dVar18);
                  }
                  else {
                    dVar18 = SQRT(dVar18);
                  }
                  local_248[1] = dVar18 * dVar18;
                  dVar18 = (pRVar16[5] * local_1f0 +
                           pRVar16[2] * local_218[3] + dStack_1f8 * pRVar16[4]) * local_1f0 +
                           (pRVar16[2] * local_1f0 +
                           *pRVar16 * local_218[3] + pRVar16[1] * dStack_1f8) * local_218[3] +
                           (pRVar16[4] * local_1f0 +
                           pRVar16[1] * local_218[3] + pRVar16[3] * dStack_1f8) * dStack_1f8;
                  if (dVar18 < 0.0) {
                    dVar18 = sqrt(dVar18);
                  }
                  else {
                    dVar18 = SQRT(dVar18);
                  }
                  local_248[2] = dVar18 * dVar18;
                  if (0.0 < local_1d0) {
                    if (local_180[1] <= 1.0) {
                      pcVar13 = "eig 0";
                      uVar10 = 0x93b;
                      goto LAB_001d223f;
                    }
                    local_248[0] = local_1a0;
                  }
                  if (0.0 < local_1d8) {
                    if (local_248[0] < 0.0) {
                      dVar18 = sqrt(local_248[0]);
                    }
                    else {
                      dVar18 = SQRT(local_248[0]);
                    }
                    if (local_248[0] < 0.0) {
                      local_1b0 = dVar18 * 1e+20;
                      dVar20 = sqrt(local_248[0]);
                      dVar18 = local_1b0;
                    }
                    else {
                      dVar20 = SQRT(local_248[0]);
                      dVar18 = dVar18 * 1e+20;
                    }
                    if (dVar20 * *(double *)(&DAT_0021b510 + (ulong)(0.0 < dVar18) * 8) <= 1.0) {
                      pcVar13 = "eig 0";
                      uVar10 = 0x93f;
                      goto LAB_001d223f;
                    }
                    if (local_248[0] < 0.0) {
                      dVar18 = sqrt(local_248[0]);
                    }
                    else {
                      dVar18 = SQRT(local_248[0]);
                    }
                    dVar20 = 1.0 / dVar18;
                    if (local_1d8 <= 1.0 / dVar18) {
                      dVar20 = local_1d8;
                    }
                    dVar18 = dVar20 * 1e+20 * dVar20;
                    if (dVar18 <= -dVar18) {
                      dVar18 = -dVar18;
                    }
                    if (dVar18 <= 1.0) {
                      pcVar13 = "eig 0";
                      uVar10 = 0x942;
                      goto LAB_001d223f;
                    }
                    local_248[0] = 1.0 / (dVar20 * dVar20);
                  }
                  if ((1.0 < local_1e0) &&
                     (dVar18 = local_248[1] * local_1e0 * local_1e0, local_248[2] <= dVar18)) {
                    local_248[2] = dVar18;
                  }
                  uVar3 = ref_matrix_form_m(local_248,local_68);
                  if (uVar3 != 0) {
                    pcVar13 = "form";
                    uVar10 = 0x94b;
                    goto LAB_001d24f3;
                  }
                  uVar3 = ref_matrix_log_m(local_68,&local_108);
                  if (uVar3 != 0) {
                    pcVar13 = "form";
                    uVar10 = 0x94c;
                    goto LAB_001d24f3;
                  }
                  lVar6 = 0;
                  do {
                    dVar20 = (vector_00 + local_188 + lVar6)[1];
                    dVar18 = local_100[lVar6];
                    vector_00[local_188 + lVar6] =
                         vector_00[local_188 + lVar6] + local_100[lVar6 + -1];
                    (vector_00 + local_188 + lVar6)[1] = dVar20 + dVar18;
                    lVar6 = lVar6 + 2;
                  } while (lVar6 != 6);
                  vector[(long)local_180[0]] = vector[(long)local_180[0]] + 1;
                  lVar6 = local_190 + 1;
                  ref_node = local_1a8;
                } while (lVar6 < ref_cell->node_per);
              }
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < ref_cell->max);
        }
        uVar3 = ref_node_ghost_dbl(ref_node,vector_00,6);
        if (uVar3 == 0) {
          uVar3 = ref_node_ghost_int(ref_node,vector,1);
          if (uVar3 == 0) {
            iVar15 = ref_node->max;
            if (0 < iVar15) {
              lVar6 = 0;
              pRVar16 = vector_00;
              do {
                if ((-1 < ref_node->global[lVar6]) && (0 < vector[lVar6])) {
                  auVar22._0_8_ = (double)vector[lVar6];
                  auVar22._8_8_ = auVar22._0_8_;
                  lVar8 = 0;
                  do {
                    auVar21 = divpd(*(undefined1 (*) [16])(pRVar16 + lVar8),auVar22);
                    *(undefined1 (*) [16])(pRVar16 + lVar8) = auVar21;
                    lVar8 = lVar8 + 2;
                  } while (lVar8 != 6);
                  vector[lVar6] = -1;
                  uVar3 = ref_matrix_exp_m(vector_00 + lVar6 * 6,metric + lVar6 * 6);
                  if (uVar3 != 0) {
                    pcVar13 = "form";
                    uVar10 = 0x95f;
                    goto LAB_001d24f3;
                  }
                  iVar15 = ref_node->max;
                }
                lVar6 = lVar6 + 1;
                pRVar16 = pRVar16 + 6;
              } while (lVar6 < iVar15);
            }
            uVar3 = ref_edge_create(local_168,local_198);
            if (uVar3 == 0) {
              if (0 < local_168[0]->n) {
                pRVar1 = local_168[0]->e2n;
                lVar6 = 0;
                do {
                  iVar15 = pRVar1[lVar6 * 2];
                  lVar11 = (long)iVar15;
                  iVar5 = pRVar1[lVar6 * 2 + 1];
                  lVar8 = (long)iVar5;
                  iVar12 = vector[lVar11];
                  if ((-1 < iVar12) && (vector[lVar8] == -1)) {
                    lVar14 = 0;
                    do {
                      vector_00[lVar11 * 6 + lVar14] =
                           vector_00[iVar5 * 6 + lVar14] + vector_00[lVar11 * 6 + lVar14];
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 6);
                    iVar12 = iVar12 + 1;
                    vector[lVar11] = iVar12;
                  }
                  iVar5 = vector[lVar8];
                  if ((-1 < iVar5) && (iVar12 == -1)) {
                    lVar11 = 0;
                    do {
                      vector_00[lVar8 * 6 + lVar11] =
                           vector_00[iVar15 * 6 + lVar11] + vector_00[lVar8 * 6 + lVar11];
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 6);
                    vector[lVar8] = iVar5 + 1;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < local_168[0]->n);
              }
              ref_edge_free(local_168[0]);
              uVar3 = ref_node_ghost_dbl(ref_node,vector_00,6);
              if (uVar3 == 0) {
                uVar3 = ref_node_ghost_int(ref_node,vector,1);
                if (uVar3 == 0) {
                  iVar15 = ref_node->max;
                  if (0 < iVar15) {
                    lVar6 = 0;
                    pRVar16 = vector_00;
                    do {
                      if ((-1 < ref_node->global[lVar6]) && (0 < vector[lVar6])) {
                        auVar25._0_8_ = (double)vector[lVar6];
                        auVar25._8_8_ = auVar25._0_8_;
                        lVar8 = 0;
                        do {
                          auVar22 = divpd(*(undefined1 (*) [16])(pRVar16 + lVar8),auVar25);
                          *(undefined1 (*) [16])(pRVar16 + lVar8) = auVar22;
                          lVar8 = lVar8 + 2;
                        } while (lVar8 != 6);
                        vector[lVar6] = -2;
                        uVar3 = ref_matrix_exp_m(vector_00 + lVar6 * 6,metric + lVar6 * 6);
                        if (uVar3 != 0) {
                          pcVar13 = "form";
                          uVar10 = 0x984;
                          goto LAB_001d24f3;
                        }
                        iVar15 = ref_node->max;
                      }
                      lVar6 = lVar6 + 1;
                      pRVar16 = pRVar16 + 6;
                    } while (lVar6 < iVar15);
                  }
                  uVar3 = ref_node_ghost_dbl(ref_node,metric,6);
                  if (uVar3 == 0) {
                    free(vector_00);
                    free(vector);
                    return 0;
                  }
                  pcVar13 = "ghost metric";
                  uVar10 = 0x988;
                }
                else {
                  pcVar13 = "ghost hits";
                  uVar10 = 0x97b;
                }
              }
              else {
                pcVar13 = "ghost metric";
                uVar10 = 0x97a;
              }
            }
            else {
              pcVar13 = "orig edges";
              uVar10 = 0x966;
            }
          }
          else {
            pcVar13 = "ghost hits";
            uVar10 = 0x956;
          }
        }
        else {
          pcVar13 = "ghost metric";
          uVar10 = 0x955;
        }
LAB_001d24f3:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar10,"ref_metric_faceid_spacing",(ulong)uVar3,pcVar13);
        return uVar3;
      }
      pcVar13 = "malloc new_log_metric of REF_DBL NULL";
      uVar10 = 0x92d;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar10
           ,"ref_metric_faceid_spacing",pcVar13);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_faceid_spacing(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_INT faceid,
                                             REF_DBL set_normal_spacing,
                                             REF_DBL ceil_normal_spacing,
                                             REF_DBL tangential_aspect_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *new_log_metric;
  REF_INT *hits;
  REF_INT node;
  REF_INT i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (faceid == nodes[ref_cell_id_index(ref_cell)]) {
      REF_DBL normal[3];
      REF_INT cell_node;
      RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal area");
      RSS(ref_math_normalize(normal), "normalize");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        REF_DBL d[12], m[6], logm[6];
        REF_DBL h;
        node = nodes[cell_node];
        RSS(ref_metric_closest_d(normal, &(metric[6 * node]), d), "closest");
        if (set_normal_spacing > 0.0) {
          h = set_normal_spacing;
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (ceil_normal_spacing > 0.0) {
          RAS(ref_math_divisible(1.0, sqrt(ref_matrix_eig(d, 0))), "eig 0");
          h = 1.0 / sqrt(ref_matrix_eig(d, 0));
          h = MIN(h, ceil_normal_spacing);
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (tangential_aspect_ratio > 1.0) {
          ref_matrix_eig(d, 2) =
              MAX(ref_matrix_eig(d, 2), ref_matrix_eig(d, 1) *
                                            tangential_aspect_ratio *
                                            tangential_aspect_ratio);
        }
        RSS(ref_matrix_form_m(d, m), "form");
        RSS(ref_matrix_log_m(m, logm), "form");
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node] += logm[i];
        }
        hits[node] += 1;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}